

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzconnect.cpp
# Opt level: O2

int __thiscall TPZConnect::CheckDependency(TPZConnect *this,int nshape,TPZCompMesh *mesh,int nstate)

{
  long lVar1;
  int iVar2;
  TPZConnect *this_00;
  ostream *poVar3;
  TPZDepend *pTVar4;
  
  pTVar4 = this->fDependList;
  if (pTVar4 != (TPZDepend *)0x0) {
    for (; pTVar4 != (TPZDepend *)0x0; pTVar4 = pTVar4->fNext) {
      if ((pTVar4->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
          fRow != (long)nshape) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "TPZConnect::CheckDependency inconsistent dependency nshape = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,nshape);
        poVar3 = std::operator<<(poVar3," nrows ");
LAB_01087549:
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        return -1;
      }
      lVar1 = (pTVar4->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol;
      this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                           pTVar4->fDepConnectIndex);
      iVar2 = NDof(this_00,mesh);
      if (lVar1 * nstate - (long)iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "TPZConnect::CheckDependency inconsistent dependency ndof = ");
        iVar2 = NDof(this_00,mesh);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        poVar3 = std::operator<<(poVar3," ncols ");
        goto LAB_01087549;
      }
      if (this_00->fDependList != (TPZDepend *)0x0) {
        iVar2 = NDof(this_00,mesh);
        iVar2 = CheckDependency(this_00,iVar2 / nstate,mesh,nstate);
        if (iVar2 == -1) {
          return -1;
        }
      }
    }
  }
  return 0;
}

Assistant:

TPZConnect::TPZDepend::~TPZDepend() {
	if(fNext) delete fNext;
}